

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basicGenerators.h
# Opt level: O2

Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>
* __thiscall
LazyCode::read<int,std::ifstream>
          (Generator<Reader,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_charliewolf[P]lazyCode_include_lazyCode_basicGenerators_h:304:22)>
           *__return_storage_ptr__,LazyCode *this,
          basic_ifstream<char,_std::char_traits<char>_> *stream)

{
  Reader RStack_238;
  
  read<int,std::ifstream>(std::ifstream&&)::Reader::Reader(std::ifstream___
            (&RStack_238,(basic_ifstream<char,_std::char_traits<char>_> *)this);
  Reader::Reader(&__return_storage_ptr__->member,&RStack_238);
  std::ifstream::~ifstream(&RStack_238);
  return __return_storage_ptr__;
}

Assistant:

auto read(Stream&& stream) {
    struct Reader {
        Stream stream;
        std::istream_iterator<ReadType> first;
        std::istream_iterator<ReadType> last;
        Reader(Stream&& stream)
            : stream(std::forward<Stream>(stream)), first(this->stream) {}
    };
    return generator(Reader(std::forward<Stream>(stream)),
                     [](auto&& reader) mutable -> optional<ReadType> {
                         if (reader.first == reader.last) {
                             return nullopt;
                         }
                         decltype(auto) val = *reader.first;
                         ++reader.first;
                         return val;
                     });
}